

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

Atom * __thiscall Potassco::SmodelsConvert::SmData::mapAtom(SmData *this,Atom_t a)

{
  uint uVar1;
  pointer pAVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)a;
  pAVar2 = (this->atoms_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->atoms_).
                super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 2;
  if (uVar4 < uVar3) {
    if (((uint)pAVar2[uVar4] & 0xfffffff) != 0) goto LAB_0010facf;
    if (uVar3 <= uVar4) goto LAB_0010fa9c;
  }
  else {
LAB_0010fa9c:
    std::
    vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
    ::resize(&this->atoms_,(ulong)(a + 1));
  }
  uVar1 = this->next_;
  this->next_ = uVar1 + 1;
  pAVar2 = (this->atoms_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2[uVar4] = (Atom)((uint)pAVar2[uVar4] & 0xf0000000 | uVar1 & 0xfffffff);
  pAVar2 = (this->atoms_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
           ._M_impl.super__Vector_impl_data._M_start;
LAB_0010facf:
  return pAVar2 + uVar4;
}

Assistant:

Atom&  mapAtom(Atom_t a) {
		if (mapped(a)) { return atoms_[a]; }
		if (a >= atoms_.size()) { atoms_.resize(a + 1); }
		atoms_[a].smId = next_++;
		return atoms_[a];
	}